

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

void clean_other_for_line(Am_Object *o2,Am_Object *line,Am_Slot_Key slot)

{
  char cVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Slot_Key *pAVar4;
  ushort uVar5;
  Am_Value v;
  
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  uVar5 = (ushort)o2;
  pAVar2 = (Am_Value *)Am_Object::Get(uVar5,(ulong)INPUT_1);
  Am_Value::operator=(&v,pAVar2);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(line);
  cVar1 = Am_Value::operator==(&v,pAVar3);
  if (cVar1 == '\0') {
    pAVar2 = (Am_Value *)Am_Object::Get(uVar5,(ulong)INPUT_2);
    Am_Value::operator=(&v,pAVar2);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(line);
    cVar1 = Am_Value::operator==(&v,pAVar3);
    if (cVar1 == '\0') {
      line_for_list(o2,line,true);
      pAVar4 = &OUTPUT_1;
    }
    else {
      Am_Object::Set(uVar5,(uint)INPUT_2,0);
      pAVar4 = &INPUT_2;
    }
  }
  else {
    Am_Object::Set(uVar5,(uint)INPUT_1,0);
    pAVar4 = &INPUT_1;
  }
  Am_Object::Set((ushort)line,(uint)slot,(ulong)*pAVar4);
  Am_Value::~Am_Value(&v);
  return;
}

Assistant:

void clean_other_for_line(Am_Object &o2, Am_Object &line, Am_Slot_Key slot) {
  Am_Value v;
  v = o2.Peek(INPUT_1);
  if (v == line) {
    o2.Set(INPUT_1, 0);
    line.Set(slot, INPUT_1, Am_OK_IF_NOT_THERE);
  }
  else {
    v = o2.Peek(INPUT_2);
    if (v == line) {
      o2.Set(INPUT_2, 0);
      line.Set(slot, INPUT_2, Am_OK_IF_NOT_THERE);
    }
    else {
      line_for_list(o2, line, true);
      line.Set(slot, OUTPUT_1, Am_OK_IF_NOT_THERE);
    }
  }
}